

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O1

rotation_t *
opengv::relative_pose::twopt_rotationOnly
          (rotation_t *__return_storage_ptr__,RelativeAdapterBase *adapter,size_t index0,
          size_t index1)

{
  double dVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  rotation_t *prVar16;
  size_t sVar17;
  ulong uVar18;
  double *pdVar19;
  long lVar20;
  ulong uVar21;
  ActualDstType actualDst;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  MatrixXd Hcross;
  Vector3d f;
  DenseStorage<double,__1,__1,__1,_0> local_128;
  undefined1 local_108 [16];
  double local_f8;
  double dStack_f0;
  undefined1 local_e8 [16];
  double local_d8;
  double dStack_d0;
  undefined1 local_c8 [16];
  double local_b8;
  rotation_t *local_a8;
  size_t local_a0;
  double local_98 [10];
  undefined1 local_48 [16];
  
  local_108._8_8_ = local_108._0_8_;
  local_e8._8_8_ = local_e8._0_8_;
  local_a8 = __return_storage_ptr__;
  (*adapter->_vptr_RelativeAdapterBase[2])(local_98);
  (*adapter->_vptr_RelativeAdapterBase[2])(&local_128,adapter,index1);
  local_d8 = local_98[0] + (double)local_128.m_data;
  dStack_d0 = local_98[1] + (double)local_128.m_rows;
  local_e8._0_8_ = local_98[2] + (double)local_128.m_cols;
  (*adapter->_vptr_RelativeAdapterBase[3])(local_98,adapter,index0);
  (*adapter->_vptr_RelativeAdapterBase[3])(&local_128,adapter,index1);
  local_f8 = local_98[0] + (double)local_128.m_data;
  dStack_f0 = local_98[1] + (double)local_128.m_rows;
  local_108._0_8_ = local_98[2] + (double)local_128.m_cols;
  local_128.m_data = (double *)0x0;
  local_128.m_rows = 0;
  local_128.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_128,9,3,3);
  local_a0 = index1;
  if ((local_128.m_rows != 3) || (local_128.m_cols != 3)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_128,9,3,3);
  }
  pdVar19 = local_128.m_data;
  uVar22 = local_128.m_rows * local_128.m_cols;
  uVar21 = uVar22 + 7;
  if (-1 < (long)uVar22) {
    uVar21 = uVar22;
  }
  uVar23 = uVar21 & 0xfffffffffffffff8;
  if (7 < (long)uVar22) {
    uVar18 = 8;
    if (8 < (long)uVar23) {
      uVar18 = uVar23;
    }
    memset(local_128.m_data,0,uVar18 * 8);
  }
  if ((long)uVar23 < (long)uVar22) {
    memset(pdVar19 + ((long)uVar21 >> 3) * 8,0,uVar22 * 8 + ((long)uVar21 >> 3) * -0x40);
  }
  (*adapter->_vptr_RelativeAdapterBase[2])(local_98,adapter,index0);
  local_48._8_8_ = 0x4008000000000000;
  local_48._0_8_ = 0x4008000000000000;
  auVar10._8_8_ = dStack_d0;
  auVar10._0_8_ = local_d8;
  auVar9 = vdivpd_avx(auVar10,local_48);
  local_d8 = (double)local_e8._0_8_ / 3.0;
  auVar12._8_8_ = local_98[1];
  auVar12._0_8_ = local_98[0];
  local_c8 = vsubpd_avx(auVar12,auVar9);
  local_b8 = local_98[2] - local_d8;
  local_e8 = auVar9;
  (*adapter->_vptr_RelativeAdapterBase[3])(local_98,adapter,index0);
  sVar17 = local_a0;
  auVar9._8_8_ = dStack_f0;
  auVar9._0_8_ = local_f8;
  auVar9 = vdivpd_avx(auVar9,local_48);
  local_f8 = (double)local_108._0_8_ / 3.0;
  pdVar19 = local_98 + 2;
  auVar13._8_8_ = local_98[1];
  auVar13._0_8_ = local_98[0];
  auVar10 = vsubpd_avx(auVar13,auVar9);
  dVar11 = local_98[2] - local_f8;
  lVar20 = 0;
  do {
    dVar1 = *(double *)(local_c8 + lVar20 * 8);
    pdVar19[-2] = auVar10._0_8_ * dVar1;
    pdVar19[-1] = auVar10._8_8_ * dVar1;
    *pdVar19 = dVar11 * dVar1;
    lVar20 = lVar20 + 1;
    pdVar19 = pdVar19 + 3;
  } while (lVar20 != 3);
  uVar22 = local_128.m_cols * local_128.m_rows;
  uVar21 = uVar22 + 7;
  if (-1 < (long)uVar22) {
    uVar21 = uVar22;
  }
  if (7 < (long)uVar22) {
    lVar20 = 0;
    do {
      auVar24 = vaddpd_avx512f(*(undefined1 (*) [64])(local_98 + lVar20),
                               *(undefined1 (*) [64])(local_128.m_data + lVar20));
      *(undefined1 (*) [64])(local_128.m_data + lVar20) = auVar24;
      lVar20 = lVar20 + 8;
    } while (lVar20 < (long)(uVar21 & 0xfffffffffffffff8));
  }
  if ((long)uVar22 % 8 != 0 && (long)(uVar21 & 0xfffffffffffffff8) <= (long)uVar22) {
    lVar20 = (long)uVar21 >> 3;
    auVar24 = vpbroadcastq_avx512f();
    uVar21 = 0;
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar26 = vpbroadcastq_avx512f();
      auVar26 = vporq_avx512f(auVar26,auVar25);
      uVar23 = vpcmpuq_avx512f(auVar26,auVar24,2);
      pdVar19 = local_98 + lVar20 * 8 + uVar21;
      bVar2 = (byte)uVar23;
      auVar26._8_8_ = (ulong)((byte)(uVar23 >> 1) & 1) * (long)pdVar19[1];
      auVar26._0_8_ = (ulong)(bVar2 & 1) * (long)*pdVar19;
      auVar26._16_8_ = (ulong)((byte)(uVar23 >> 2) & 1) * (long)pdVar19[2];
      auVar26._24_8_ = (ulong)((byte)(uVar23 >> 3) & 1) * (long)pdVar19[3];
      auVar26._32_8_ = (ulong)((byte)(uVar23 >> 4) & 1) * (long)pdVar19[4];
      auVar26._40_8_ = (ulong)((byte)(uVar23 >> 5) & 1) * (long)pdVar19[5];
      auVar26._48_8_ = (ulong)((byte)(uVar23 >> 6) & 1) * (long)pdVar19[6];
      auVar26._56_8_ = (uVar23 >> 7) * (long)pdVar19[7];
      pdVar19 = local_128.m_data + lVar20 * 8 + uVar21;
      auVar27._8_8_ = (ulong)((byte)(uVar23 >> 1) & 1) * (long)pdVar19[1];
      auVar27._0_8_ = (ulong)(bVar2 & 1) * (long)*pdVar19;
      auVar27._16_8_ = (ulong)((byte)(uVar23 >> 2) & 1) * (long)pdVar19[2];
      auVar27._24_8_ = (ulong)((byte)(uVar23 >> 3) & 1) * (long)pdVar19[3];
      auVar27._32_8_ = (ulong)((byte)(uVar23 >> 4) & 1) * (long)pdVar19[4];
      auVar27._40_8_ = (ulong)((byte)(uVar23 >> 5) & 1) * (long)pdVar19[5];
      auVar27._48_8_ = (ulong)((byte)(uVar23 >> 6) & 1) * (long)pdVar19[6];
      auVar27._56_8_ = (uVar23 >> 7) * (long)pdVar19[7];
      auVar26 = vaddpd_avx512f(auVar26,auVar27);
      pdVar19 = local_128.m_data + lVar20 * 8 + uVar21;
      bVar3 = (bool)((byte)(uVar23 >> 1) & 1);
      bVar4 = (bool)((byte)(uVar23 >> 2) & 1);
      bVar5 = (bool)((byte)(uVar23 >> 3) & 1);
      bVar6 = (bool)((byte)(uVar23 >> 4) & 1);
      bVar7 = (bool)((byte)(uVar23 >> 5) & 1);
      bVar8 = (bool)((byte)(uVar23 >> 6) & 1);
      *pdVar19 = (double)((ulong)(bVar2 & 1) * auVar26._0_8_ |
                         (ulong)!(bool)(bVar2 & 1) * (long)*pdVar19);
      pdVar19[1] = (double)((ulong)bVar3 * auVar26._8_8_ | (ulong)!bVar3 * (long)pdVar19[1]);
      pdVar19[2] = (double)((ulong)bVar4 * auVar26._16_8_ | (ulong)!bVar4 * (long)pdVar19[2]);
      pdVar19[3] = (double)((ulong)bVar5 * auVar26._24_8_ | (ulong)!bVar5 * (long)pdVar19[3]);
      pdVar19[4] = (double)((ulong)bVar6 * auVar26._32_8_ | (ulong)!bVar6 * (long)pdVar19[4]);
      pdVar19[5] = (double)((ulong)bVar7 * auVar26._40_8_ | (ulong)!bVar7 * (long)pdVar19[5]);
      pdVar19[6] = (double)((ulong)bVar8 * auVar26._48_8_ | (ulong)!bVar8 * (long)pdVar19[6]);
      pdVar19[7] = (double)((uVar23 >> 7) * auVar26._56_8_ |
                           (ulong)!SUB81(uVar23 >> 7,0) * (long)pdVar19[7]);
      uVar21 = uVar21 + 8;
    } while (((long)uVar22 % 8 + 7U & 0xfffffffffffffff8) != uVar21);
  }
  local_108 = auVar9;
  (*adapter->_vptr_RelativeAdapterBase[2])(local_98,adapter,local_a0);
  auVar14._8_8_ = local_98[1];
  auVar14._0_8_ = local_98[0];
  local_c8 = vsubpd_avx(auVar14,local_e8);
  local_b8 = local_98[2] - local_d8;
  (*adapter->_vptr_RelativeAdapterBase[3])(local_98,adapter,sVar17);
  prVar16 = local_a8;
  pdVar19 = local_98 + 2;
  auVar15._8_8_ = local_98[1];
  auVar15._0_8_ = local_98[0];
  auVar9 = vsubpd_avx(auVar15,local_108);
  lVar20 = 0;
  do {
    dVar11 = *(double *)(local_c8 + lVar20 * 8);
    pdVar19[-2] = auVar9._0_8_ * dVar11;
    pdVar19[-1] = auVar9._8_8_ * dVar11;
    *pdVar19 = (local_98[2] - local_f8) * dVar11;
    lVar20 = lVar20 + 1;
    pdVar19 = pdVar19 + 3;
  } while (lVar20 != 3);
  uVar22 = local_128.m_cols * local_128.m_rows;
  uVar21 = uVar22 + 7;
  if (-1 < (long)uVar22) {
    uVar21 = uVar22;
  }
  if (7 < (long)uVar22) {
    lVar20 = 0;
    do {
      auVar24 = vaddpd_avx512f(*(undefined1 (*) [64])(local_98 + lVar20),
                               *(undefined1 (*) [64])(local_128.m_data + lVar20));
      *(undefined1 (*) [64])(local_128.m_data + lVar20) = auVar24;
      lVar20 = lVar20 + 8;
    } while (lVar20 < (long)(uVar21 & 0xfffffffffffffff8));
  }
  if ((long)uVar22 % 8 != 0 && (long)(uVar21 & 0xfffffffffffffff8) <= (long)uVar22) {
    lVar20 = (long)uVar21 >> 3;
    auVar24 = vpbroadcastq_avx512f();
    uVar21 = 0;
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar26 = vpbroadcastq_avx512f();
      auVar26 = vporq_avx512f(auVar26,auVar25);
      uVar23 = vpcmpuq_avx512f(auVar26,auVar24,2);
      pdVar19 = local_98 + lVar20 * 8 + uVar21;
      bVar2 = (byte)uVar23;
      auVar28._8_8_ = (ulong)((byte)(uVar23 >> 1) & 1) * (long)pdVar19[1];
      auVar28._0_8_ = (ulong)(bVar2 & 1) * (long)*pdVar19;
      auVar28._16_8_ = (ulong)((byte)(uVar23 >> 2) & 1) * (long)pdVar19[2];
      auVar28._24_8_ = (ulong)((byte)(uVar23 >> 3) & 1) * (long)pdVar19[3];
      auVar28._32_8_ = (ulong)((byte)(uVar23 >> 4) & 1) * (long)pdVar19[4];
      auVar28._40_8_ = (ulong)((byte)(uVar23 >> 5) & 1) * (long)pdVar19[5];
      auVar28._48_8_ = (ulong)((byte)(uVar23 >> 6) & 1) * (long)pdVar19[6];
      auVar28._56_8_ = (uVar23 >> 7) * (long)pdVar19[7];
      pdVar19 = local_128.m_data + lVar20 * 8 + uVar21;
      auVar29._8_8_ = (ulong)((byte)(uVar23 >> 1) & 1) * (long)pdVar19[1];
      auVar29._0_8_ = (ulong)(bVar2 & 1) * (long)*pdVar19;
      auVar29._16_8_ = (ulong)((byte)(uVar23 >> 2) & 1) * (long)pdVar19[2];
      auVar29._24_8_ = (ulong)((byte)(uVar23 >> 3) & 1) * (long)pdVar19[3];
      auVar29._32_8_ = (ulong)((byte)(uVar23 >> 4) & 1) * (long)pdVar19[4];
      auVar29._40_8_ = (ulong)((byte)(uVar23 >> 5) & 1) * (long)pdVar19[5];
      auVar29._48_8_ = (ulong)((byte)(uVar23 >> 6) & 1) * (long)pdVar19[6];
      auVar29._56_8_ = (uVar23 >> 7) * (long)pdVar19[7];
      auVar26 = vaddpd_avx512f(auVar28,auVar29);
      pdVar19 = local_128.m_data + lVar20 * 8 + uVar21;
      bVar3 = (bool)((byte)(uVar23 >> 1) & 1);
      bVar4 = (bool)((byte)(uVar23 >> 2) & 1);
      bVar5 = (bool)((byte)(uVar23 >> 3) & 1);
      bVar6 = (bool)((byte)(uVar23 >> 4) & 1);
      bVar7 = (bool)((byte)(uVar23 >> 5) & 1);
      bVar8 = (bool)((byte)(uVar23 >> 6) & 1);
      *pdVar19 = (double)((ulong)(bVar2 & 1) * auVar26._0_8_ |
                         (ulong)!(bool)(bVar2 & 1) * (long)*pdVar19);
      pdVar19[1] = (double)((ulong)bVar3 * auVar26._8_8_ | (ulong)!bVar3 * (long)pdVar19[1]);
      pdVar19[2] = (double)((ulong)bVar4 * auVar26._16_8_ | (ulong)!bVar4 * (long)pdVar19[2]);
      pdVar19[3] = (double)((ulong)bVar5 * auVar26._24_8_ | (ulong)!bVar5 * (long)pdVar19[3]);
      pdVar19[4] = (double)((ulong)bVar6 * auVar26._32_8_ | (ulong)!bVar6 * (long)pdVar19[4]);
      pdVar19[5] = (double)((ulong)bVar7 * auVar26._40_8_ | (ulong)!bVar7 * (long)pdVar19[5]);
      pdVar19[6] = (double)((ulong)bVar8 * auVar26._48_8_ | (ulong)!bVar8 * (long)pdVar19[6]);
      pdVar19[7] = (double)((uVar23 >> 7) * auVar26._56_8_ |
                           (ulong)!SUB81(uVar23 >> 7,0) * (long)pdVar19[7]);
      uVar21 = uVar21 + 8;
    } while (((long)uVar22 % 8 + 7U & 0xfffffffffffffff8) != uVar21);
  }
  math::arun(local_a8,(MatrixXd *)&local_128);
  if (local_128.m_data != (double *)0x0) {
    free((void *)local_128.m_data[-1]);
  }
  return prVar16;
}

Assistant:

opengv::rotation_t
opengv::relative_pose::twopt_rotationOnly(
    const RelativeAdapterBase & adapter,
    size_t index0,
    size_t index1)
{
  Eigen::Vector3d pointsCenter1 =
      adapter.getBearingVector1(index0) + adapter.getBearingVector1(index1);
  Eigen::Vector3d pointsCenter2 =
      adapter.getBearingVector2(index0) + adapter.getBearingVector2(index1);
  pointsCenter1 = pointsCenter1/3.0;
  pointsCenter2 = pointsCenter2/3.0;

  Eigen::MatrixXd Hcross(3,3);
  Hcross = Eigen::Matrix3d::Zero();

  Eigen::Vector3d f = adapter.getBearingVector1(index0) - pointsCenter1;
  Eigen::Vector3d fprime = adapter.getBearingVector2(index0) - pointsCenter2;
  Hcross += fprime * f.transpose();
  f = adapter.getBearingVector1(index1) - pointsCenter1;
  fprime = adapter.getBearingVector2(index1) - pointsCenter2;
  Hcross += fprime * f.transpose();

  return math::arun(Hcross);
}